

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O2

void __thiscall
google::ErrnoLogMessage::ErrnoLogMessage
          (ErrnoLogMessage *this,char *file,int line,LogSeverity severity,int64 ctr,
          SendMethod send_method)

{
  LogMessage::LogMessage(&this->super_LogMessage,file,line,severity,ctr,send_method);
  return;
}

Assistant:

ErrnoLogMessage::ErrnoLogMessage(const char* file, int line,
                                 LogSeverity severity, int64 ctr,
                                 void (LogMessage::*send_method)())
    : LogMessage(file, line, severity, ctr, send_method) {}